

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_NV_CERTIFY_INFO_Unmarshal(TPMS_NV_CERTIFY_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_NV_CERTIFY_INFO *target_local;
  
  target_local._4_4_ = TPM2B_NAME_Unmarshal(&target->indexName,buffer,size);
  if ((target_local._4_4_ == 0) &&
     (target_local._4_4_ = UINT16_Unmarshal(&target->offset,buffer,size), target_local._4_4_ == 0))
  {
    target_local._4_4_ = TPM2B_MAX_NV_BUFFER_Unmarshal(&target->nvContents,buffer,size);
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_NV_CERTIFY_INFO_Unmarshal(TPMS_NV_CERTIFY_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->indexName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT16_Unmarshal((UINT16 *)&(target->offset), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_MAX_NV_BUFFER_Unmarshal((TPM2B_MAX_NV_BUFFER *)&(target->nvContents), buffer, size);
    return result;
}